

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>::
setCapacity(Vector<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
            *this,size_t newSize)

{
  Entry *pEVar1;
  size_t sVar2;
  uint uVar3;
  RemoveConst<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
  *pRVar4;
  ulong uVar5;
  Entry *pEVar6;
  __off_t in_RDX;
  ArrayBuilder<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
  newBuilder;
  ArrayBuilder<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
  local_38;
  
  uVar5 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 3) * 0x6db6db6db6db6db7;
  if (newSize <= uVar5 && uVar5 - newSize != 0) {
    ArrayBuilder<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
    ::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                    (0x38,0,newSize,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pEVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pEVar6 = (this->builder).ptr; pEVar6 != pEVar1; pEVar6 = pEVar6 + 1) {
    sVar2 = (pEVar6->key).content.size_;
    ((local_38.pos)->key).content.ptr = (pEVar6->key).content.ptr;
    ((local_38.pos)->key).content.size_ = sVar2;
    uVar3 = (pEVar6->value).index;
    ((local_38.pos)->value).type = (pEVar6->value).type;
    ((local_38.pos)->value).index = uVar3;
    ((local_38.pos)->value).prefixLength = (pEVar6->value).prefixLength;
    ((local_38.pos)->value).ownName.content.ptr = (pEVar6->value).ownName.content.ptr;
    ((local_38.pos)->value).ownName.content.size_ = (pEVar6->value).ownName.content.size_;
    ((local_38.pos)->value).ownName.content.disposer = (pEVar6->value).ownName.content.disposer;
    local_38.pos = local_38.pos + 1;
    (pEVar6->value).ownName.content.ptr = (char *)0x0;
    (pEVar6->value).ownName.content.size_ = 0;
  }
  ArrayBuilder<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
  ::operator=(&this->builder,&local_38);
  pEVar1 = local_38.endPtr;
  pRVar4 = local_38.pos;
  pEVar6 = local_38.ptr;
  if (local_38.ptr != (Entry *)0x0) {
    local_38.ptr = (Entry *)0x0;
    local_38.pos = (RemoveConst<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
                    *)0x0;
    local_38.endPtr = (Entry *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pEVar6,0x38,((long)pRVar4 - (long)pEVar6 >> 3) * 0x6db6db6db6db6db7
               ,((long)pEVar1 - (long)pEVar6 >> 3) * 0x6db6db6db6db6db7,
               ArrayDisposer::
               Dispose_<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
               ::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }